

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O0

int __thiscall
highs::RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>::unlink
          (RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *this,char *__name)

{
  bool bVar1;
  LinkType LVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  HighsUInt color;
  LinkType LVar3;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int iVar4;
  RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *unaff_retaddr;
  LinkType zLeft;
  LinkType zRight;
  LinkType x;
  bool yWasBlack;
  LinkType y;
  LinkType nilParent;
  Dir in_stack_ffffffffffffffc8;
  HighsUInt in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  LinkType in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  uint v;
  HighsUInt HVar5;
  HighsUInt HVar6;
  LinkType LVar7;
  RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *pRVar8;
  
  LVar3 = (LinkType)__name;
  HVar6 = 0xffffffff;
  LVar7 = LVar3;
  pRVar8 = this;
  bVar1 = isBlack(this,in_stack_ffffffffffffffcc);
  v = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffe8);
  LVar2 = getChild(this,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  if (LVar2 == -1) {
    LVar2 = getChild(this,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    transplant((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
               CONCAT44(LVar7,HVar6),LVar3,v,(LinkType *)CONCAT44(LVar2,in_stack_ffffffffffffffe0));
    iVar4 = extraout_EAX;
  }
  else {
    LVar2 = getChild(this,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    if (LVar2 == -1) {
      LVar2 = getChild(this,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
      transplant((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
                 CONCAT44(LVar7,HVar6),LVar3,v,(LinkType *)CONCAT44(LVar2,in_stack_ffffffffffffffe0)
                );
      iVar4 = extraout_EAX_00;
    }
    else {
      getChild(this,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
      color = first((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
                    CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                    (LinkType)((ulong)this >> 0x20));
      bVar1 = isBlack(this,in_stack_ffffffffffffffcc);
      v = CONCAT13(bVar1,(int3)v);
      LVar2 = getChild(this,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
      LVar3 = getParent(this,in_stack_ffffffffffffffcc);
      if (LVar3 == LVar7) {
        HVar5 = color;
        if (LVar2 != -1) {
          setParent(this,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
          HVar5 = HVar6;
        }
      }
      else {
        HVar5 = color;
        getChild(this,color,in_stack_ffffffffffffffc8);
        transplant((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
                   CONCAT44(LVar7,HVar6),HVar5,v,
                   (LinkType *)CONCAT44(LVar2,in_stack_ffffffffffffffe0));
        in_stack_ffffffffffffffe0 = getChild(this,color,in_stack_ffffffffffffffc8);
        setChild(this,color,in_stack_ffffffffffffffc8,0);
        setParent(this,color,in_stack_ffffffffffffffc8);
        in_stack_ffffffffffffffcc = color;
        color = HVar5;
        HVar5 = HVar6;
      }
      transplant((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
                 CONCAT44(LVar7,HVar5),color,v,(LinkType *)CONCAT44(LVar2,in_stack_ffffffffffffffe0)
                );
      getChild(this,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
      setChild(this,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,0);
      setParent(this,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
      getColor(this,in_stack_ffffffffffffffcc);
      setColor(this,in_stack_ffffffffffffffcc,color);
      iVar4 = extraout_EAX_01;
    }
  }
  if ((v & 0x1000000) != 0) {
    deleteFixup(unaff_retaddr,(LinkType)((ulong)pRVar8 >> 0x20),(LinkType)pRVar8);
    iVar4 = extraout_EAX_02;
  }
  return iVar4;
}

Assistant:

void unlink(LinkType z) {
    LinkType nilParent = kNoLink;
    LinkType y = z;
    bool yWasBlack = isBlack(y);
    LinkType x;

    if (getChild(z, kLeft) == kNoLink) {
      x = getChild(z, kRight);
      transplant(z, x, nilParent);
    } else if (getChild(z, kRight) == kNoLink) {
      x = getChild(z, kLeft);
      transplant(z, x, nilParent);
    } else {
      y = first(getChild(z, kRight));
      yWasBlack = isBlack(y);
      x = getChild(y, kRight);
      if (getParent(y) == z) {
        if (x == kNoLink)
          nilParent = y;
        else
          setParent(x, y);
      } else {
        transplant(y, getChild(y, kRight), nilParent);
        LinkType zRight = getChild(z, kRight);
        setChild(y, kRight, zRight);
        setParent(zRight, y);
      }
      transplant(z, y, nilParent);
      LinkType zLeft = getChild(z, kLeft);
      setChild(y, kLeft, zLeft);
      setParent(zLeft, y);
      setColor(y, getColor(z));
    }

    if (yWasBlack) deleteFixup(x, nilParent);
  }